

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void affect_modify_room(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *paf,bool fAdd)

{
  short sVar1;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  short *unaff_retaddr;
  CLogger *in_stack_00000008;
  string_view in_stack_00000010;
  int mod;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  short local_18;
  
  local_18 = *(short *)(in_RSI + 0x1c);
  if ((in_DL & 1) == 0) {
    sVar1 = *(short *)(in_RSI + 0x12);
    if (sVar1 == 0) {
      BITWISE_XAND((long *)(in_RDI + 0x168),(long *)(in_RSI + 0x20));
    }
    else if ((sVar1 != 1) && (sVar1 == 2)) {
      BITWISE_XAND((long *)(in_RDI + 0x140),(long *)(in_RSI + 0x20));
    }
    local_18 = -local_18;
  }
  else {
    sVar1 = *(short *)(in_RSI + 0x12);
    if (sVar1 == 0) {
      BITWISE_OR((long *)(in_RDI + 0x168),(long *)(in_RSI + 0x20));
    }
    else if ((sVar1 != 1) && (sVar1 == 2)) {
      BITWISE_OR((long *)(in_RDI + 0x140),(long *)(in_RSI + 0x20));
    }
  }
  switch(*(undefined2 *)(in_RSI + 0x1a)) {
  case 0:
    break;
  case 1:
    *(short *)(in_RDI + 0x152) = *(short *)(in_RDI + 0x152) + local_18;
    break;
  case 2:
    *(short *)(in_RDI + 0x154) = *(short *)(in_RDI + 0x154) + local_18;
    break;
  case 3:
    *(short *)(in_RDI + 0x150) = *(short *)(in_RDI + 0x150) + local_18;
    break;
  case 4:
    break;
  default:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    CLogger::Warn<short&>(in_stack_00000008,in_stack_00000010,unaff_retaddr);
  }
  return;
}

Assistant:

void affect_modify_room(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *paf, bool fAdd)
{
	int mod = paf->modifier;

	if (fAdd)
	{
		switch (paf->where)
		{
			case TO_ROOM_AFFECTS:
				BITWISE_OR(room->affected_by, paf->bitvector);
				break;
			case TO_ROOM_FLAGS:
				BITWISE_OR(room->room_flags, paf->bitvector);
				break;
			case TO_ROOM_CONST:
				break;
		}
	}
	else
	{
		switch (paf->where)
		{
			case TO_ROOM_AFFECTS:
				BITWISE_XAND(room->affected_by, paf->bitvector);
				break;
			case TO_ROOM_FLAGS:
				BITWISE_XAND(room->room_flags, paf->bitvector);
				break;
			case TO_ROOM_CONST:
				break;
		}

		mod = 0 - mod;
	}

	switch (paf->location)
	{
		case APPLY_ROOM_NONE:
			break;
		case APPLY_ROOM_NOPE:
			break;
		case APPLY_ROOM_HEAL:
			room->heal_rate += mod;
			break;
		case APPLY_ROOM_MANA:
			room->mana_rate += mod;
			break;
		case APPLY_ROOM_SECT:
			room->sector_type += mod;
			break;
		default:
			RS.Logger.Warn("Affect_modify_room: unknown location {}.", paf->location);
			break;
	}
}